

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O1

int ffgpxf(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,char *nullarray,
          int *anynul,int *status)

{
  int iVar1;
  int naxis;
  LONGLONG tfirstpix [99];
  
  iVar1 = *status;
  if (nelem != 0 && iVar1 < 1) {
    ffgidm(fptr,&naxis,status);
    if (0 < (long)naxis) {
      memcpy(tfirstpix,firstpix,(long)naxis << 3);
    }
    ffgpxfll(fptr,datatype,tfirstpix,nelem,array,nullarray,anynul,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgpxf( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *firstpix,   /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,       /* I - number of values to read            */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - returned array of null value flags      */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  The nullarray values will = 1 if the corresponding array value is null.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    LONGLONG tfirstpix[99];
    int naxis, ii;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);

    for (ii=0; ii < naxis; ii++)
       tfirstpix[ii] = firstpix[ii];

    ffgpxfll(fptr, datatype, tfirstpix, nelem, array, nullarray, anynul, status);

    return(*status);
}